

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

void cache_block(BGZF *fp,int size)

{
  kh_cache_t *h_00;
  khint_t kVar1;
  cache_t *pcVar2;
  uint8_t *puVar3;
  kh_cache_t *h;
  cache_t *p;
  int local_18;
  khint_t k;
  int ret;
  int size_local;
  BGZF *fp_local;
  
  h_00 = (kh_cache_t *)fp->cache;
  if (0x10000 < fp->cache_size) {
    k = size;
    _ret = fp;
    if ((uint)fp->cache_size < (h_00->size + 1) * 0x10000) {
      p._4_4_ = 0;
      while ((p._4_4_ < h_00->n_buckets &&
             ((h_00->flags[p._4_4_ >> 4] >> (sbyte)((p._4_4_ & 0xf) << 1) & 3) != 0))) {
        p._4_4_ = p._4_4_ + 1;
      }
      if (p._4_4_ < h_00->n_buckets) {
        free(h_00->vals[p._4_4_].block);
        kh_del_cache(h_00,p._4_4_);
      }
    }
    kVar1 = kh_put_cache(h_00,_ret->block_address,&local_18);
    if (local_18 != 0) {
      pcVar2 = h_00->vals + kVar1;
      pcVar2->size = _ret->block_length;
      pcVar2->end_offset = _ret->block_address + (long)(int)k;
      puVar3 = (uint8_t *)malloc(0x10000);
      pcVar2->block = puVar3;
      memcpy(h_00->vals[kVar1].block,_ret->uncompressed_block,0x10000);
    }
  }
  return;
}

Assistant:

static void cache_block(BGZF *fp, int size)
{
    int ret;
    khint_t k;
    cache_t *p;
    khash_t(cache) *h = (khash_t(cache)*)fp->cache;
    if (BGZF_MAX_BLOCK_SIZE >= fp->cache_size) return;
    if ((kh_size(h) + 1) * BGZF_MAX_BLOCK_SIZE > (uint32_t)fp->cache_size) {
        /* A better way would be to remove the oldest block in the
         * cache, but here we remove a random one for simplicity. This
         * should not have a big impact on performance. */
        for (k = kh_begin(h); k < kh_end(h); ++k)
            if (kh_exist(h, k)) break;
        if (k < kh_end(h)) {
            free(kh_val(h, k).block);
            kh_del(cache, h, k);
        }
    }
    k = kh_put(cache, h, fp->block_address, &ret);
    if (ret == 0) return; // if this happens, a bug!
    p = &kh_val(h, k);
    p->size = fp->block_length;
    p->end_offset = fp->block_address + size;
    p->block = (uint8_t*)malloc(BGZF_MAX_BLOCK_SIZE);
    memcpy(kh_val(h, k).block, fp->uncompressed_block, BGZF_MAX_BLOCK_SIZE);
}